

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBufferPool.cpp
# Opt level: O1

void __thiscall
VulkanUtilities::VulkanCommandBufferPool::~VulkanCommandBufferPool(VulkanCommandBufferPool *this)

{
  _Elt_pointer ppVVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char (*in_RCX) [236];
  _Map_pointer pppVVar2;
  _Elt_pointer ppVVar3;
  _Elt_pointer ppVVar4;
  string msg;
  string local_48;
  
  if ((this->m_BuffCounter).super___atomic_base<int>._M_i != 0) {
    Diligent::FormatString<std::atomic<int>,char[236]>
              (&local_48,(Diligent *)&this->m_BuffCounter,
               (atomic<int> *)
               " command buffer(s) have not been returned to the pool. If there are outstanding references to these buffers in release queues, VulkanCommandBufferPool::RecycleCommandBuffer() will crash when attempting to return the buffer to the pool."
               ,in_RCX);
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"~VulkanCommandBufferPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBufferPool.cpp"
               ,0x3c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  ppVVar4 = (this->m_CmdBuffers).
            super__Deque_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppVVar1 = (this->m_CmdBuffers).
            super__Deque_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar4 != ppVVar1) {
    ppVVar3 = (this->m_CmdBuffers).
              super__Deque_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    pppVVar2 = (this->m_CmdBuffers).
               super__Deque_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    do {
      VulkanLogicalDevice::FreeCommandBuffer
                ((this->m_LogicalDevice).
                 super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(this->m_CmdPool).m_VkObject,*ppVVar4);
      ppVVar4 = ppVVar4 + 1;
      if (ppVVar4 == ppVVar3) {
        ppVVar4 = pppVVar2[1];
        pppVVar2 = pppVVar2 + 1;
        ppVVar3 = ppVVar4 + 0x40;
      }
    } while (ppVVar4 != ppVVar1);
  }
  VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::Release
            (&this->m_CmdPool);
  std::_Deque_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::~_Deque_base
            (&(this->m_CmdBuffers).
              super__Deque_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>);
  VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::
  ~VulkanObjectWrapper(&this->m_CmdPool);
  this_00 = (this->m_LogicalDevice).
            super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

VulkanCommandBufferPool::~VulkanCommandBufferPool()
{
    DEV_CHECK_ERR(m_BuffCounter == 0, m_BuffCounter,
                  " command buffer(s) have not been returned to the pool. If there are outstanding references to these "
                  "buffers in release queues, VulkanCommandBufferPool::RecycleCommandBuffer() will crash when attempting to "
                  "return the buffer to the pool.");

    for (auto CmdBuff : m_CmdBuffers)
        m_LogicalDevice->FreeCommandBuffer(m_CmdPool, CmdBuff);
    m_CmdPool.Release();
}